

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonArray.cpp
# Opt level: O2

bool __thiscall Json::JsonArray::put(JsonArray *this,JsonValue *jsonValue)

{
  json_array_citerator jVar1;
  shared_ptr<Json::JsonValue> sStack_28;
  
  if ((jsonValue != (JsonValue *)0x0) &&
     (jVar1 = find(this,jsonValue),
     jVar1._M_current ==
     (this->__lstJsonArray).
     super__Vector_base<std::shared_ptr<Json::JsonValue>,_std::allocator<std::shared_ptr<Json::JsonValue>_>_>
     ._M_impl.super__Vector_impl_data._M_finish)) {
    (*jsonValue->_vptr_JsonValue[6])(jsonValue,(ulong)(byte)(this->super_JsonFormatter).field_0x26);
    std::__shared_ptr<Json::JsonValue,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<Json::JsonValue,void>
              ((__shared_ptr<Json::JsonValue,(__gnu_cxx::_Lock_policy)2> *)&sStack_28,jsonValue);
    std::vector<std::shared_ptr<Json::JsonValue>,std::allocator<std::shared_ptr<Json::JsonValue>>>::
    emplace_back<std::shared_ptr<Json::JsonValue>>
              ((vector<std::shared_ptr<Json::JsonValue>,std::allocator<std::shared_ptr<Json::JsonValue>>>
                *)&this->__lstJsonArray,&sStack_28);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&sStack_28.super___shared_ptr<Json::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    return true;
  }
  return false;
}

Assistant:

bool Json::JsonArray::put(JsonValue *jsonValue) {
    if (!jsonValue) return false;
    if (find(jsonValue) != __lstJsonArray.end())return false;
    jsonValue->setEscapeChar(__escape);
    __lstJsonArray.push_back(std::shared_ptr<JsonValue>(jsonValue));
    return true;
}